

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall cmake::ActualConfigure(cmake *this)

{
  cmState *pcVar1;
  cmCacheManager *pcVar2;
  cmState *pcVar3;
  cmMakefile *this_00;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  cmGlobalGenerator *pcVar9;
  cmGlobalUnixMakefileGenerator3 *this_01;
  string fullName;
  undefined1 local_90 [32];
  string local_70;
  string local_50;
  
  UpdateConversionPathTable(this);
  cmState::Reset((Snapshot *)local_90,this->State);
  (this->CurrentSnapshot).Position.Position = local_90._16_8_;
  (this->CurrentSnapshot).State = (cmState *)local_90._0_8_;
  (this->CurrentSnapshot).Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_90._8_8_;
  cmState::RemoveUserDefinedCommands(this->State);
  if (this->CurrentWorkingMode == NORMAL_MODE) {
    iVar5 = DoPreConfigureChecks(this);
    if (-1 < iVar5) {
      if (iVar5 == 0) goto LAB_002c0175;
      goto LAB_002c01ee;
    }
LAB_002c0872:
    iVar5 = -2;
  }
  else {
LAB_002c0175:
    pcVar2 = this->CacheManager;
    local_90._0_8_ = (cmState *)(local_90 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"CMAKE_HOME_DIRECTORY","");
    pcVar6 = cmState::GetSourceDirectory(this->State);
    cmCacheManager::AddCacheEntry
              (pcVar2,(string *)local_90,pcVar6,
               "Source directory with the top level CMakeLists.txt file for this project",INTERNAL);
    if ((cmState *)local_90._0_8_ != (cmState *)(local_90 + 0x10)) {
      operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
    }
LAB_002c01ee:
    pcVar1 = (cmState *)(local_90 + 0x10);
    if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
      pcVar2 = this->CacheManager;
      local_90._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"CMAKE_GENERATOR","");
      pcVar6 = cmCacheManager::GetInitializedCacheValue(pcVar2,(string *)local_90);
      if ((cmState *)local_90._0_8_ != pcVar1) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
      }
      pcVar2 = this->CacheManager;
      local_90._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"CMAKE_EXTRA_GENERATOR","")
      ;
      pcVar7 = cmCacheManager::GetInitializedCacheValue(pcVar2,(string *)local_90);
      if ((cmState *)local_90._0_8_ != pcVar1) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
      }
      if (pcVar6 != (char *)0x0) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        sVar8 = strlen(pcVar6);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar6,pcVar6 + sVar8);
        pcVar6 = "";
        if (pcVar7 != (char *)0x0) {
          pcVar6 = pcVar7;
        }
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        sVar8 = strlen(pcVar6);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar6,pcVar6 + sVar8);
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                  ((string *)local_90,&local_70,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        pcVar9 = CreateGlobalGenerator(this,(string *)local_90);
        this->GlobalGenerator = pcVar9;
        if ((cmState *)local_90._0_8_ != pcVar1) {
          operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
        }
      }
      if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
        cmSystemTools::s_ForceUnixPaths = this->GlobalGenerator->ForceUnixPaths;
        goto LAB_002c039a;
      }
      this_01 = (cmGlobalUnixMakefileGenerator3 *)operator_new(0x668);
      cmGlobalUnixMakefileGenerator3::cmGlobalUnixMakefileGenerator3(this_01,this);
      SetGlobalGenerator(this,(cmGlobalGenerator *)this_01);
      if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) goto LAB_002c039a;
      cmSystemTools::Error("Could not create generator",(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
LAB_002c039a:
      pcVar2 = this->CacheManager;
      local_90._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"CMAKE_GENERATOR","");
      pcVar6 = cmCacheManager::GetInitializedCacheValue(pcVar2,(string *)local_90);
      if ((cmState *)local_90._0_8_ != pcVar1) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
      }
      if (pcVar6 != (char *)0x0) {
        pcVar9 = this->GlobalGenerator;
        local_90._0_8_ = pcVar1;
        sVar8 = strlen(pcVar6);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_90,pcVar6,pcVar6 + sVar8);
        iVar5 = (*pcVar9->_vptr_cmGlobalGenerator[3])(pcVar9,local_90);
        if ((cmState *)local_90._0_8_ != pcVar1) {
          operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
        }
        if ((char)iVar5 != '\0') goto LAB_002c043b;
        local_90._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"Error: generator : ","")
        ;
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[2])(&local_70);
        std::__cxx11::string::_M_append(local_90,(ulong)local_70._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append(local_90);
        std::__cxx11::string::append(local_90);
        std::__cxx11::string::append(local_90);
        cmSystemTools::Error((char *)local_90._0_8_,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_002c085b:
        if ((cmState *)local_90._0_8_ != pcVar1) {
          operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
        }
        goto LAB_002c0872;
      }
LAB_002c043b:
      pcVar2 = this->CacheManager;
      local_90._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"CMAKE_GENERATOR","");
      pcVar6 = cmCacheManager::GetInitializedCacheValue(pcVar2,(string *)local_90);
      if ((cmState *)local_90._0_8_ != pcVar1) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
      }
      if (pcVar6 == (char *)0x0) {
        pcVar2 = this->CacheManager;
        local_90._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"CMAKE_GENERATOR","");
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[2])(&local_70);
        cmCacheManager::AddCacheEntry
                  (pcVar2,(string *)local_90,local_70._M_dataplus._M_p,"Name of generator.",INTERNAL
                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((cmState *)local_90._0_8_ != pcVar1) {
          operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
        }
        pcVar2 = this->CacheManager;
        local_90._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_90,"CMAKE_EXTRA_GENERATOR","");
        cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_(&local_70,this->GlobalGenerator);
        cmCacheManager::AddCacheEntry
                  (pcVar2,(string *)local_90,local_70._M_dataplus._M_p,
                   "Name of external makefile project generator.",INTERNAL);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((cmState *)local_90._0_8_ != pcVar1) {
          operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
        }
      }
      pcVar2 = this->CacheManager;
      local_90._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,"CMAKE_GENERATOR_PLATFORM","");
      pcVar6 = cmCacheManager::GetInitializedCacheValue(pcVar2,(string *)local_90);
      if ((cmState *)local_90._0_8_ != pcVar1) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
      }
      if (pcVar6 == (char *)0x0) {
        pcVar2 = this->CacheManager;
        local_90._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_90,"CMAKE_GENERATOR_PLATFORM","");
        cmCacheManager::AddCacheEntry
                  (pcVar2,(string *)local_90,(this->GeneratorPlatform)._M_dataplus._M_p,
                   "Name of generator platform.",INTERNAL);
        if ((cmState *)local_90._0_8_ != pcVar1) {
          operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
        }
      }
      else if ((this->GeneratorPlatform)._M_string_length == 0) {
        strlen(pcVar6);
        std::__cxx11::string::_M_replace
                  ((ulong)&this->GeneratorPlatform,0,(char *)0x0,(ulong)pcVar6);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&this->GeneratorPlatform);
        if (iVar5 != 0) {
          local_90._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_90,"Error: generator platform: ","");
          std::__cxx11::string::_M_append
                    (local_90,(ulong)(this->GeneratorPlatform)._M_dataplus._M_p);
          std::__cxx11::string::append(local_90);
          std::__cxx11::string::append(local_90);
          std::__cxx11::string::append(local_90);
          cmSystemTools::Error((char *)local_90._0_8_,(char *)0x0,(char *)0x0,(char *)0x0);
          goto LAB_002c085b;
        }
      }
      pcVar2 = this->CacheManager;
      local_90._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,"CMAKE_GENERATOR_TOOLSET","");
      pcVar6 = cmCacheManager::GetInitializedCacheValue(pcVar2,(string *)local_90);
      if ((cmState *)local_90._0_8_ != pcVar1) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
      }
      if (pcVar6 == (char *)0x0) {
        pcVar2 = this->CacheManager;
        local_90._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_90,"CMAKE_GENERATOR_TOOLSET","");
        cmCacheManager::AddCacheEntry
                  (pcVar2,(string *)local_90,(this->GeneratorToolset)._M_dataplus._M_p,
                   "Name of generator toolset.",INTERNAL);
        if ((cmState *)local_90._0_8_ != pcVar1) {
          operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
        }
      }
      else if ((this->GeneratorToolset)._M_string_length == 0) {
        strlen(pcVar6);
        std::__cxx11::string::_M_replace((ulong)&this->GeneratorToolset,0,(char *)0x0,(ulong)pcVar6)
        ;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&this->GeneratorToolset);
        if (iVar5 != 0) {
          local_90._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_90,"Error: generator toolset: ","");
          std::__cxx11::string::_M_append(local_90,(ulong)(this->GeneratorToolset)._M_dataplus._M_p)
          ;
          std::__cxx11::string::append(local_90);
          std::__cxx11::string::append(local_90);
          std::__cxx11::string::append(local_90);
          cmSystemTools::Error((char *)local_90._0_8_,(char *)0x0,(char *)0x0,(char *)0x0);
          goto LAB_002c085b;
        }
      }
      bVar4 = cmState::GetIsInTryCompile(this->State);
      if (!bVar4) {
        cmGlobalGenerator::ClearEnabledLanguages(this->GlobalGenerator);
        TruncateOutputLog(this,"CMakeOutput.log");
        TruncateOutputLog(this,"CMakeError.log");
      }
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[7])();
      pcVar3 = this->State;
      local_90._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,"CMAKE_BACKWARDS_COMPATIBILITY","");
      pcVar6 = cmState::GetInitializedCacheValue(pcVar3,(string *)local_90);
      if ((cmState *)local_90._0_8_ != pcVar1) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
      }
      if (pcVar6 != (char *)0x0) {
        pcVar3 = this->State;
        local_90._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"LIBRARY_OUTPUT_PATH","")
        ;
        pcVar6 = cmState::GetInitializedCacheValue(pcVar3,(string *)local_90);
        if ((cmState *)local_90._0_8_ != pcVar1) {
          operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
        }
        if (pcVar6 == (char *)0x0) {
          pcVar3 = this->State;
          local_90._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_90,"LIBRARY_OUTPUT_PATH","");
          cmState::AddCacheEntry
                    (pcVar3,(string *)local_90,"",
                     "Single output directory for building all libraries.",PATH);
          if ((cmState *)local_90._0_8_ != pcVar1) {
            operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
          }
        }
        pcVar3 = this->State;
        local_90._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_90,"EXECUTABLE_OUTPUT_PATH","");
        pcVar6 = cmState::GetInitializedCacheValue(pcVar3,(string *)local_90);
        if ((cmState *)local_90._0_8_ != pcVar1) {
          operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
        }
        if (pcVar6 == (char *)0x0) {
          pcVar3 = this->State;
          local_90._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_90,"EXECUTABLE_OUTPUT_PATH","");
          cmState::AddCacheEntry
                    (pcVar3,(string *)local_90,"",
                     "Single output directory for building all executables.",PATH);
          if ((cmState *)local_90._0_8_ != pcVar1) {
            operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
          }
        }
      }
      if ((cmSystemTools::s_FatalErrorOccured != false) ||
         (bVar4 = cmSystemTools::GetInterruptFlag(), bVar4)) {
        pcVar3 = this->State;
        local_90._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"CMAKE_MAKE_PROGRAM","");
        pcVar6 = cmState::GetInitializedCacheValue(pcVar3,(string *)local_90);
        if ((cmState *)local_90._0_8_ != pcVar1) {
          operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
        }
        if ((pcVar6 == (char *)0x0) || (bVar4 = cmSystemTools::IsOff(pcVar6), bVar4)) {
          pcVar3 = this->State;
          local_90._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"CMAKE_GENERATOR","");
          cmState::RemoveCacheEntry(pcVar3,(string *)local_90);
          if ((cmState *)local_90._0_8_ != pcVar1) {
            operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
          }
          pcVar3 = this->State;
          local_90._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_90,"CMAKE_EXTRA_GENERATOR","");
          cmState::RemoveCacheEntry(pcVar3,(string *)local_90);
          if ((cmState *)local_90._0_8_ != pcVar1) {
            operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
          }
        }
      }
      this_00 = (*(this->GlobalGenerator->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start)->Makefile;
      local_90._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"CTEST_USE_LAUNCHERS","");
      bVar4 = cmMakefile::IsOn(this_00,(string *)local_90);
      if (bVar4) {
        pcVar3 = this->State;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"RULE_LAUNCH_COMPILE","");
        pcVar6 = cmState::GetGlobalProperty(pcVar3,&local_70);
        bVar4 = pcVar6 == (char *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar4 = false;
      }
      if ((cmState *)local_90._0_8_ != pcVar1) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
      }
      if (bVar4) {
        cmSystemTools::Error
                  ("CTEST_USE_LAUNCHERS is enabled, but the RULE_LAUNCH_COMPILE global property is not defined.\nDid you forget to include(CTest) in the toplevel CMakeLists.txt ?"
                   ,(char *)0x0,(char *)0x0,(char *)0x0);
      }
      if (this->CurrentWorkingMode == NORMAL_MODE) {
        pcVar2 = this->CacheManager;
        pcVar6 = cmState::GetBinaryDirectory(this->State);
        std::__cxx11::string::string((string *)local_90,pcVar6,(allocator *)&local_70);
        cmCacheManager::SaveCache(pcVar2,(string *)local_90);
        if ((cmState *)local_90._0_8_ != pcVar1) {
          operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
        }
      }
      if (((cmSystemTools::s_ErrorOccured == false) && (cmSystemTools::s_FatalErrorOccured == false)
          ) && (bVar4 = cmSystemTools::GetInterruptFlag(), !bVar4)) {
        return 0;
      }
    }
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

int cmake::ActualConfigure()
{
  // Construct right now our path conversion table before it's too late:
  this->UpdateConversionPathTable();
  this->CleanupCommandsAndMacros();

  int res = 0;
  if ( this->GetWorkingMode() == NORMAL_MODE )
    {
    res = this->DoPreConfigureChecks();
    }
  if ( res < 0 )
    {
    return -2;
    }
  if ( !res )
    {
    this->CacheManager->AddCacheEntry
      ("CMAKE_HOME_DIRECTORY",
       this->GetHomeDirectory(),
       "Source directory with the top level CMakeLists.txt file for this "
       "project",
       cmState::INTERNAL);
    }

  // no generator specified on the command line
  if(!this->GlobalGenerator)
    {
    const char* genName =
      this->CacheManager->GetInitializedCacheValue("CMAKE_GENERATOR");
    const char* extraGenName =
      this->CacheManager->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
    if(genName)
      {
      std::string fullName = cmExternalMakefileProjectGenerator::
                                CreateFullGeneratorName(genName,
                                    extraGenName ? extraGenName : "");
      this->GlobalGenerator = this->CreateGlobalGenerator(fullName);
      }
    if(this->GlobalGenerator)
      {
      // set the global flag for unix style paths on cmSystemTools as
      // soon as the generator is set.  This allows gmake to be used
      // on windows.
      cmSystemTools::SetForceUnixPaths
        (this->GlobalGenerator->GetForceUnixPaths());
      }
    else
      {
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(CMAKE_BOOT_MINGW)
      std::string installedCompiler;
      // Try to find the newest VS installed on the computer and
      // use that as a default if -G is not specified
      const std::string vsregBase =
        "[HKEY_LOCAL_MACHINE\\SOFTWARE\\Microsoft\\";
      std::vector<std::string> vsVerions;
      vsVerions.push_back("VisualStudio\\");
      vsVerions.push_back("VCExpress\\");
      vsVerions.push_back("WDExpress\\");
      struct VSRegistryEntryName
      {
        const char* MSVersion;
        const char* GeneratorName;
      };
      VSRegistryEntryName version[] = {
        {"6.0", "Visual Studio 6"},
        {"7.0", "Visual Studio 7"},
        {"7.1", "Visual Studio 7 .NET 2003"},
        {"8.0", "Visual Studio 8 2005"},
        {"9.0", "Visual Studio 9 2008"},
        {"10.0", "Visual Studio 10 2010"},
        {"11.0", "Visual Studio 11 2012"},
        {"12.0", "Visual Studio 12 2013"},
        {"14.0", "Visual Studio 14 2015"},
        {0, 0}};
      for(int i=0; version[i].MSVersion != 0; i++)
        {
        for(size_t b=0; b < vsVerions.size(); b++)
          {
          std::string reg = vsregBase + vsVerions[b] + version[i].MSVersion;
          reg += ";InstallDir]";
          cmSystemTools::ExpandRegistryValues(reg,
                                              cmSystemTools::KeyWOW64_32);
          if (!(reg == "/registry"))
            {
            installedCompiler = version[i].GeneratorName;
            break;
            }
          }
        }
      cmGlobalGenerator* gen
        = this->CreateGlobalGenerator(installedCompiler.c_str());
      if(!gen)
        {
        gen = new cmGlobalNMakeMakefileGenerator(this);
        }
      this->SetGlobalGenerator(gen);
      std::cout << "-- Building for: " << gen->GetName() << "\n";
#else
      this->SetGlobalGenerator(new cmGlobalUnixMakefileGenerator3(this));
#endif
      }
    if(!this->GlobalGenerator)
      {
      cmSystemTools::Error("Could not create generator");
      return -1;
      }
    }

  const char* genName = this->CacheManager
                            ->GetInitializedCacheValue("CMAKE_GENERATOR");
  if(genName)
    {
    if(!this->GlobalGenerator->MatchesGeneratorName(genName))
      {
      std::string message = "Error: generator : ";
      message += this->GlobalGenerator->GetName();
      message += "\nDoes not match the generator used previously: ";
      message += genName;
      message +=
        "\nEither remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
      }
    }
  if(!this->CacheManager->GetInitializedCacheValue("CMAKE_GENERATOR"))
    {
    this->CacheManager->AddCacheEntry("CMAKE_GENERATOR",
                                      this->GlobalGenerator->GetName().c_str(),
                                      "Name of generator.",
                                      cmState::INTERNAL);
    this->CacheManager->AddCacheEntry("CMAKE_EXTRA_GENERATOR",
                        this->GlobalGenerator->GetExtraGeneratorName().c_str(),
                        "Name of external makefile project generator.",
                        cmState::INTERNAL);
    }

  if(const char* platformName =
     this->CacheManager->GetInitializedCacheValue("CMAKE_GENERATOR_PLATFORM"))
    {
    if(this->GeneratorPlatform.empty())
      {
      this->GeneratorPlatform = platformName;
      }
    else if(this->GeneratorPlatform != platformName)
      {
      std::string message = "Error: generator platform: ";
      message += this->GeneratorPlatform;
      message += "\nDoes not match the platform used previously: ";
      message += platformName;
      message +=
        "\nEither remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
      }
    }
  else
    {
    this->CacheManager->AddCacheEntry("CMAKE_GENERATOR_PLATFORM",
                                      this->GeneratorPlatform.c_str(),
                                      "Name of generator platform.",
                                      cmState::INTERNAL);
    }

  if(const char* tsName =
     this->CacheManager->GetInitializedCacheValue("CMAKE_GENERATOR_TOOLSET"))
    {
    if(this->GeneratorToolset.empty())
      {
      this->GeneratorToolset = tsName;
      }
    else if(this->GeneratorToolset != tsName)
      {
      std::string message = "Error: generator toolset: ";
      message += this->GeneratorToolset;
      message += "\nDoes not match the toolset used previously: ";
      message += tsName;
      message +=
        "\nEither remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
      }
    }
  else
    {
    this->CacheManager->AddCacheEntry("CMAKE_GENERATOR_TOOLSET",
                                      this->GeneratorToolset.c_str(),
                                      "Name of generator toolset.",
                                      cmState::INTERNAL);
    }

  // reset any system configuration information, except for when we are
  // InTryCompile. With TryCompile the system info is taken from the parent's
  // info to save time
  if (!this->State->GetIsInTryCompile())
    {
    this->GlobalGenerator->ClearEnabledLanguages();

    this->TruncateOutputLog("CMakeOutput.log");
    this->TruncateOutputLog("CMakeError.log");
    }

  // actually do the configure
  this->GlobalGenerator->Configure();
  // Before saving the cache
  // if the project did not define one of the entries below, add them now
  // so users can edit the values in the cache:

  // We used to always present LIBRARY_OUTPUT_PATH and
  // EXECUTABLE_OUTPUT_PATH.  They are now documented as old-style and
  // should no longer be used.  Therefore we present them only if the
  // project requires compatibility with CMake 2.4.  We detect this
  // here by looking for the old CMAKE_BACKWARDS_COMPATIBILITY
  // variable created when CMP0001 is not set to NEW.
  if(this->State
         ->GetInitializedCacheValue("CMAKE_BACKWARDS_COMPATIBILITY"))
    {
    if(!this->State->GetInitializedCacheValue("LIBRARY_OUTPUT_PATH"))
      {
      this->State->AddCacheEntry
        ("LIBRARY_OUTPUT_PATH", "",
         "Single output directory for building all libraries.",
         cmState::PATH);
      }
    if(!this->State
            ->GetInitializedCacheValue("EXECUTABLE_OUTPUT_PATH"))
      {
      this->State->AddCacheEntry
        ("EXECUTABLE_OUTPUT_PATH", "",
         "Single output directory for building all executables.",
         cmState::PATH);
      }
    }

  if(cmSystemTools::GetFatalErrorOccured())
    {
    const char* makeProgram =
        this->State->GetInitializedCacheValue("CMAKE_MAKE_PROGRAM");
    if (!makeProgram || cmSystemTools::IsOff(makeProgram))
      {
      // We must have a bad generator selection.  Wipe the cache entry so the
      // user can select another.
      this->State->RemoveCacheEntry("CMAKE_GENERATOR");
      this->State->RemoveCacheEntry("CMAKE_EXTRA_GENERATOR");
      }
    }

  cmMakefile* mf=this->GlobalGenerator->GetLocalGenerators()[0]->GetMakefile();
  if (mf->IsOn("CTEST_USE_LAUNCHERS")
              && !this->State->GetGlobalProperty("RULE_LAUNCH_COMPILE"))
    {
    cmSystemTools::Error("CTEST_USE_LAUNCHERS is enabled, but the "
                        "RULE_LAUNCH_COMPILE global property is not defined.\n"
                        "Did you forget to include(CTest) in the toplevel "
                         "CMakeLists.txt ?");
    }

  // only save the cache if there were no fatal errors
  if ( this->GetWorkingMode() == NORMAL_MODE )
    {
    this->CacheManager->SaveCache(this->GetHomeOutputDirectory());
    }
  if(cmSystemTools::GetErrorOccuredFlag())
    {
    return -1;
    }
  return 0;
}